

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductBase.h
# Opt level: O1

Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> * __thiscall
Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
lazyAssign<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>,4>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
          (MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>> *this,
          ProductBase<Eigen::GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>,_4>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_false>_>
          *other)

{
  undefined8 *puVar1;
  ulong uVar2;
  void *__s;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  Scalar local_38;
  
  uVar2 = *(ulong *)(this + 8);
  if ((long)uVar2 < 0) {
    __assert_fail("nbRows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == nbRows) && nbCols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == nbCols)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/overtane[P]udacity-carnd-p7/src/Eigen/src/Core/CwiseNullaryOp.h"
                  ,0x3f,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Map<Eigen::Matrix<double, -1, 1>>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Map<Eigen::Matrix<double, -1, 1>>]"
                 );
  }
  __s = *(void **)this;
  uVar5 = (ulong)((uint)((ulong)__s >> 3) & 1);
  if ((long)uVar2 <= (long)uVar5) {
    uVar5 = uVar2;
  }
  if (((ulong)__s & 7) != 0) {
    uVar5 = uVar2;
  }
  lVar6 = uVar2 - uVar5;
  if (0 < (long)uVar5) {
    memset(__s,0,uVar5 * 8);
  }
  lVar4 = (lVar6 - (lVar6 >> 0x3f) & 0xfffffffffffffffeU) + uVar5;
  uVar3 = uVar5;
  if (1 < lVar6) {
    do {
      puVar1 = (undefined8 *)(*(long *)this + uVar3 * 8);
      *puVar1 = 0;
      puVar1[1] = 0;
      uVar3 = uVar3 + 2;
    } while ((long)uVar3 < lVar4);
  }
  if (uVar2 - lVar4 != 0 && lVar4 <= (long)uVar2) {
    memset((void *)(uVar5 * 8 + (lVar6 / 2) * 0x10 + *(long *)this),0,(uVar2 - lVar4) * 8);
  }
  local_38 = 1.0;
  GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,-1,-1,false>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,-1,1,false>,4>
  ::scaleAndAddTo<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            ((GeneralProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>,4>
              *)other,(Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)this,
             &local_38);
  return (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)this;
}

Assistant:

Derived& MatrixBase<Derived>::lazyAssign(const ProductBase<ProductDerived, Lhs,Rhs>& other)
{
  other.derived().evalTo(derived());
  return derived();
}